

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderDNA.h
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::_defaultInitializer<1>::operator()
          (_defaultInitializer<1> *this,shared_ptr<Assimp::Blender::MTex> (*out) [18],char *reason)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Logger *this_01;
  long lVar2;
  
  this_01 = DefaultLogger::get();
  Logger::warn(this_01,reason);
  lVar2 = 8;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(*out)[0].
                       super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               + lVar2);
    puVar1 = (undefined8 *)
             ((long)&out[-1][0x11].
                     super___shared_ptr<Assimp::Blender::MTex,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x128);
  return;
}

Assistant:

void operator ()(T& out, const char* reason = "<add reason>") {
        ASSIMP_LOG_WARN(reason);

        // ... and let the show go on
        _defaultInitializer<0 /*ErrorPolicy_Igno*/>()(out);
    }